

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

String * __thiscall
Diligent::GetBufferDescString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,BufferDesc *Desc)

{
  bool bVar1;
  Char *pCVar2;
  char *in_RCX;
  Uint32 CpuAccessFlags;
  String local_f0;
  String local_d0;
  String local_b0;
  String local_90;
  String local_70;
  String local_50;
  bool local_2d;
  bool bIsLarge;
  undefined1 local_19;
  Diligent *local_18;
  BufferDesc *Desc_local;
  String *Str;
  
  local_19 = 0;
  local_18 = this;
  Desc_local = (BufferDesc *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"Size: ");
  local_2d = false;
  if (*(ulong *)(local_18 + 8) < 0x100001) {
    bVar1 = 0x400 < *(ulong *)(local_18 + 8);
    if (bVar1) {
      ToString<unsigned_long>(&local_70,*(ulong *)(local_18 + 8) >> 10);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," Kb (");
    }
  }
  else {
    ToString<unsigned_long>(&local_50,*(ulong *)(local_18 + 8) >> 0x14);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," Mb (");
    local_2d = true;
    bVar1 = local_2d;
  }
  local_2d = bVar1;
  ToString<unsigned_long>(&local_90,*(unsigned_long *)(local_18 + 8));
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__," bytes");
  if ((local_2d & 1U) != 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,')');
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"; Mode: ");
  pCVar2 = GetBufferModeString((BUFFER_MODE)local_18[0x16]);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pCVar2);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"; Usage: ");
  pCVar2 = GetUsageString((USAGE)local_18[0x14]);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pCVar2);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"; Bind Flags: ");
  GetBindFlagsString_abi_cxx11_
            (&local_b0,(Diligent *)(ulong)*(uint *)(local_18 + 0x10),0x483bf7,in_RCX);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"; CPU access: ");
  GetCPUAccessFlagsString_abi_cxx11_
            (&local_d0,(Diligent *)(ulong)(byte)local_18[0x15],CpuAccessFlags);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"; stride: ");
  ToString<unsigned_int>(&local_f0,*(uint *)(local_18 + 0x18));
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__," bytes");
  return __return_storage_ptr__;
}

Assistant:

String GetBufferDescString(const BufferDesc& Desc)
{
    String Str;
    Str += "Size: ";
    bool bIsLarge = false;
    if (Desc.Size > (1 << 20))
    {
        Str += ToString(Desc.Size / (1 << 20));
        Str += " Mb (";
        bIsLarge = true;
    }
    else if (Desc.Size > (1 << 10))
    {
        Str += ToString(Desc.Size / (1 << 10));
        Str += " Kb (";
        bIsLarge = true;
    }

    Str += ToString(Desc.Size);
    Str += " bytes";
    if (bIsLarge)
        Str += ')';

    Str += "; Mode: ";
    Str += GetBufferModeString(Desc.Mode);

    Str += "; Usage: ";
    Str += GetUsageString(Desc.Usage);

    Str += "; Bind Flags: ";
    Str += GetBindFlagsString(Desc.BindFlags);

    Str += "; CPU access: ";
    Str += GetCPUAccessFlagsString(Desc.CPUAccessFlags);

    Str += "; stride: ";
    Str += ToString(Desc.ElementByteStride);
    Str += " bytes";

    return Str;
}